

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPainterClipInfo>::moveAppend
          (QGenericArrayOps<QPainterClipInfo> *this,QPainterClipInfo *b,QPainterClipInfo *e)

{
  qsizetype *pqVar1;
  QPainterClipInfo *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QPainterClipInfo>).ptr;
    for (; b < e; b = b + 1) {
      QPainterClipInfo::QPainterClipInfo
                (pQVar2 + (this->super_QArrayDataPointer<QPainterClipInfo>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QPainterClipInfo>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }